

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O1

void __thiscall
google::protobuf::RepeatedField<unsigned_int>::Reserve
          (RepeatedField<unsigned_int> *this,int new_size)

{
  Arena *this_00;
  uint *puVar1;
  uint *puVar2;
  void **ppvVar3;
  LogMessage *other;
  undefined8 *puVar4;
  ulong n;
  int iVar5;
  LogMessage local_70;
  LogFinisher local_31;
  
  if (this->total_size_ < new_size) {
    if (this->total_size_ < 1) {
      puVar1 = (uint *)0x0;
    }
    else {
      puVar1 = elements(this);
      puVar1 = puVar1 + -2;
    }
    if (this->total_size_ == 0) {
      ppvVar3 = &this->arena_or_elements_;
    }
    else {
      puVar2 = elements(this);
      ppvVar3 = (void **)(puVar2 + -2);
    }
    this_00 = (Arena *)*ppvVar3;
    iVar5 = 4;
    if (3 < new_size) {
      if (this->total_size_ < 0x40000000) {
        iVar5 = this->total_size_ * 2;
        if (iVar5 <= new_size) {
          iVar5 = new_size;
        }
      }
      else {
        if (new_size < 0x40000001) {
          internal::LogMessage::LogMessage
                    (&local_70,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O1/src/src/google/protobuf/repeated_field.h"
                     ,0x602);
          other = internal::LogMessage::operator<<
                            (&local_70,
                             "CHECK failed: (new_size) > (kRepeatedFieldUpperClampLimit): ");
          internal::LogFinisher::operator=(&local_31,other);
          internal::LogMessage::~LogMessage(&local_70);
        }
        iVar5 = 0x7fffffff;
      }
    }
    if (this_00 == (Arena *)0x0) {
      puVar4 = (undefined8 *)operator_new((long)iVar5 * 4 + 8);
    }
    else {
      n = (long)iVar5 * 4 + 0xfU & 0xfffffffffffffff8;
      if (*(long *)(this_00 + 0x70) != 0) {
        Arena::OnArenaAllocation(this_00,(type_info *)&char::typeinfo,n);
      }
      puVar4 = (undefined8 *)Arena::AllocateAlignedNoHook(this_00,n);
    }
    *puVar4 = this_00;
    this->total_size_ = iVar5;
    this->arena_or_elements_ = puVar4 + 1;
    elements(this);
    if (0 < this->current_size_) {
      puVar2 = elements(this);
      memcpy(puVar2,puVar1 + 2,(long)this->current_size_ << 2);
    }
    if ((puVar1 != (uint *)0x0) && (*(long *)puVar1 == 0)) {
      operator_delete(puVar1);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Reserve(int new_size) {
  if (total_size_ >= new_size) return;
  Rep* old_rep = total_size_ > 0 ? rep() : NULL;
  Rep* new_rep;
  Arena* arena = GetArena();
  new_size = internal::CalculateReserveSize(total_size_, new_size);
  GOOGLE_DCHECK_LE(
      static_cast<size_t>(new_size),
      (std::numeric_limits<size_t>::max() - kRepHeaderSize) / sizeof(Element))
      << "Requested size is too large to fit into size_t.";
  size_t bytes =
      kRepHeaderSize + sizeof(Element) * static_cast<size_t>(new_size);
  if (arena == NULL) {
    new_rep = static_cast<Rep*>(::operator new(bytes));
  } else {
    new_rep = reinterpret_cast<Rep*>(Arena::CreateArray<char>(arena, bytes));
  }
  new_rep->arena = arena;
  int old_total_size = total_size_;
  // Already known: new_size >= internal::kMinRepeatedFieldAllocationSize
  // Maintain invariant:
  //     total_size_ == 0 ||
  //     total_size_ >= internal::kMinRepeatedFieldAllocationSize
  total_size_ = new_size;
  arena_or_elements_ = new_rep->elements;
  // Invoke placement-new on newly allocated elements. We shouldn't have to do
  // this, since Element is supposed to be POD, but a previous version of this
  // code allocated storage with "new Element[size]" and some code uses
  // RepeatedField with non-POD types, relying on constructor invocation. If
  // Element has a trivial constructor (e.g., int32), gcc (tested with -O2)
  // completely removes this loop because the loop body is empty, so this has no
  // effect unless its side-effects are required for correctness.
  // Note that we do this before MoveArray() below because Element's copy
  // assignment implementation will want an initialized instance first.
  Element* e = &elements()[0];
  Element* limit = e + total_size_;
  for (; e < limit; e++) {
    new (e) Element;
  }
  if (current_size_ > 0) {
    MoveArray(&elements()[0], old_rep->elements, current_size_);
  }

  // Likewise, we need to invoke destructors on the old array.
  InternalDeallocate(old_rep, old_total_size);

}